

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer.c
# Opt level: O2

CURLcode Curl_follow(SessionHandle *data,char *newurl,followtype type)

{
  char cVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  char *sep;
  char *pcVar5;
  size_t sVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  size_t __n;
  char *pcVar10;
  char *pcVar11;
  char cVar12;
  undefined1 local_61;
  char *local_60;
  int local_58;
  followtype local_54;
  char *local_50;
  char prot [16];
  
  if (type == FOLLOW_REDIR) {
    lVar2 = (data->set).followlocation;
    lVar3 = (data->set).maxredirs;
    if (lVar3 <= lVar2 && lVar3 != -1) {
      Curl_failf(data,"Maximum (%ld) redirects followed");
      return CURLE_TOO_MANY_REDIRECTS;
    }
    (data->state).this_is_a_follow = true;
    (data->set).followlocation = lVar2 + 1;
    if ((data->set).http_auto_referer == true) {
      if ((data->change).referer_alloc == true) {
        pcVar5 = (data->change).referer;
        if (pcVar5 != (char *)0x0) {
          (*Curl_cfree)(pcVar5);
          (data->change).referer = (char *)0x0;
        }
        (data->change).referer_alloc = false;
      }
      pcVar5 = (*Curl_cstrdup)((data->change).url);
      (data->change).referer = pcVar5;
      if (pcVar5 == (char *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
      (data->change).referer_alloc = true;
    }
  }
  iVar4 = __isoc99_sscanf(newurl,"%15[^?&/:]://%c",prot,&local_61);
  if (iVar4 == 2) {
    pcVar5 = strchr(newurl,0x20);
    if (pcVar5 != (char *)0x0) {
      sVar6 = strlen_url(newurl);
      pcVar5 = (char *)(*Curl_cmalloc)(sVar6 + 1);
      if (pcVar5 == (char *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
      strcpy_url(pcVar5,newurl);
      (*Curl_cfree)(newurl);
      newurl = pcVar5;
    }
  }
  else {
    pcVar5 = (*Curl_cstrdup)((data->change).url);
    if (pcVar5 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    local_54 = type;
    pcVar7 = strstr(pcVar5,"//");
    pcVar10 = pcVar7 + 2;
    if (pcVar7 == (char *)0x0) {
      pcVar10 = pcVar5;
    }
    cVar1 = *newurl;
    pcVar7 = newurl;
    local_60 = pcVar10;
    local_58 = iVar4;
    if (cVar1 == '/') {
      if (newurl[1] == '/') {
        *pcVar10 = '\0';
        pcVar7 = newurl + 2;
      }
      else {
        pcVar8 = strchr(pcVar10,0x2f);
        pcVar9 = strchr(pcVar10,0x3f);
        pcVar10 = local_60;
        if (pcVar8 == (char *)0x0) {
          if (pcVar9 != (char *)0x0) {
            *pcVar9 = '\0';
          }
        }
        else {
          pcVar11 = pcVar8;
          if (pcVar9 < pcVar8) {
            pcVar11 = pcVar9;
          }
          if (pcVar9 == (char *)0x0) {
            pcVar11 = pcVar8;
          }
          *pcVar11 = '\0';
        }
      }
    }
    else {
      pcVar10 = strchr(pcVar10,0x3f);
      if (pcVar10 != (char *)0x0) {
        *pcVar10 = '\0';
        cVar1 = *newurl;
      }
      cVar12 = '?';
      if ((cVar1 != '?') &&
         (pcVar10 = strrchr(local_60,0x2f), cVar12 = cVar1, pcVar10 != (char *)0x0)) {
        *pcVar10 = '\0';
        cVar12 = *newurl;
      }
      pcVar8 = strchr(local_60,0x2f);
      local_60 = pcVar8 + 1;
      pcVar10 = local_60;
      if (pcVar8 == (char *)0x0) {
        pcVar10 = (char *)0x0;
      }
      if (cVar12 == '.') {
        pcVar7 = newurl + (ulong)(newurl[1] == '/') * 2;
      }
      iVar4 = 0;
      for (; ((*pcVar7 == '.' && (pcVar7[1] == '.')) && (pcVar7[2] == '/')); pcVar7 = pcVar7 + 3) {
        iVar4 = iVar4 + -1;
      }
      if (pcVar8 == (char *)0x0) {
        local_60 = (char *)0x0;
        pcVar10 = local_60;
      }
      else {
        for (; iVar4 != 0; iVar4 = iVar4 + 1) {
          pcVar8 = strrchr(pcVar10,0x2f);
          if (pcVar8 == (char *)0x0) {
            *pcVar10 = '\0';
            pcVar10 = local_60;
            break;
          }
          *pcVar8 = '\0';
        }
      }
    }
    local_60 = pcVar10;
    sVar6 = strlen_url(pcVar7);
    __n = strlen(pcVar5);
    pcVar10 = (char *)(*Curl_cmalloc)(sVar6 + __n + 2);
    if (pcVar10 == (char *)0x0) {
      (*Curl_cfree)(pcVar5);
      return CURLE_OUT_OF_MEMORY;
    }
    local_50 = pcVar5;
    memcpy(pcVar10,pcVar5,__n);
    cVar1 = *pcVar7;
    if (cVar1 != '/') {
      if (local_60 == (char *)0x0) {
        if (cVar1 != '?') goto LAB_00122aef;
      }
      else if ((cVar1 != '?') && (*local_60 != '\0')) {
LAB_00122aef:
        pcVar10[__n] = '/';
        __n = __n + 1;
      }
    }
    strcpy_url(pcVar10 + __n,pcVar7);
    (*Curl_cfree)(local_50);
    type = local_54;
    if (pcVar10 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    (*Curl_cfree)(newurl);
    newurl = pcVar10;
    iVar4 = local_58;
  }
  if (type == FOLLOW_FAKE) {
    (data->info).wouldredirect = newurl;
    return CURLE_OK;
  }
  if (iVar4 == 2) {
    (data->state).allow_port = false;
  }
  if (((data->change).url_alloc == true) && (pcVar5 = (data->change).url, pcVar5 != (char *)0x0)) {
    (*Curl_cfree)(pcVar5);
  }
  (data->change).url = newurl;
  (data->change).url_alloc = true;
  Curl_infof(data,"Issue another request to this URL: \'%s\'\n",newurl);
  iVar4 = (data->info).httpcode;
  if (iVar4 == 0x12f) {
    if (((data->set).httpreq != HTTPREQ_GET) && (((data->set).keep_post & 4) == 0)) {
      (data->set).httpreq = HTTPREQ_GET;
      pcVar5 = "GET";
      if ((data->set).opt_no_body != false) {
        pcVar5 = "HEAD";
      }
      Curl_infof(data,"Disables POST, goes with %s\n",pcVar5);
    }
  }
  else {
    if (iVar4 == 0x12e) {
      if ((((data->set).httpreq & ~HTTPREQ_GET) != HTTPREQ_POST) ||
         (((data->set).keep_post & 2) != 0)) goto LAB_00122c4b;
      pcVar5 = "Violate RFC 2616/10.3.3 and switch from POST to GET\n";
    }
    else {
      if (((iVar4 != 0x12d) || (((data->set).httpreq & ~HTTPREQ_GET) != HTTPREQ_POST)) ||
         (((data->set).keep_post & 1) != 0)) goto LAB_00122c4b;
      pcVar5 = "Violate RFC 2616/10.3.2 and switch from POST to GET\n";
    }
    Curl_infof(data,pcVar5);
    (data->set).httpreq = HTTPREQ_GET;
  }
LAB_00122c4b:
  Curl_pgrsTime(data,TIMER_REDIRECT);
  Curl_pgrsResetTimesSizes(data);
  return CURLE_OK;
}

Assistant:

CURLcode Curl_follow(struct SessionHandle *data,
                     char *newurl, /* this 'newurl' is the Location: string,
                                      and it must be malloc()ed before passed
                                      here */
                     followtype type) /* see transfer.h */
{
#ifdef CURL_DISABLE_HTTP
  (void)data;
  (void)newurl;
  (void)type;
  /* Location: following will not happen when HTTP is disabled */
  return CURLE_TOO_MANY_REDIRECTS;
#else

  /* Location: redirect */
  bool disallowport = FALSE;

  if(type == FOLLOW_REDIR) {
    if((data->set.maxredirs != -1) &&
        (data->set.followlocation >= data->set.maxredirs)) {
      failf(data,"Maximum (%ld) redirects followed", data->set.maxredirs);
      return CURLE_TOO_MANY_REDIRECTS;
    }

    /* mark the next request as a followed location: */
    data->state.this_is_a_follow = TRUE;

    data->set.followlocation++; /* count location-followers */

    if(data->set.http_auto_referer) {
      /* We are asked to automatically set the previous URL as the referer
         when we get the next URL. We pick the ->url field, which may or may
         not be 100% correct */

      if(data->change.referer_alloc) {
        Curl_safefree(data->change.referer);
        data->change.referer_alloc = FALSE;
      }

      data->change.referer = strdup(data->change.url);
      if(!data->change.referer)
        return CURLE_OUT_OF_MEMORY;
      data->change.referer_alloc = TRUE; /* yes, free this later */
    }
  }

  if(!is_absolute_url(newurl))  {
    /***
     *DANG* this is an RFC 2068 violation. The URL is supposed
     to be absolute and this doesn't seem to be that!
     */
    char *absolute = concat_url(data->change.url, newurl);
    if(!absolute)
      return CURLE_OUT_OF_MEMORY;
    free(newurl);
    newurl = absolute;
  }
  else {
    /* This is an absolute URL, don't allow the custom port number */
    disallowport = TRUE;

    if(strchr(newurl, ' ')) {
      /* This new URL contains at least one space, this is a mighty stupid
         redirect but we still make an effort to do "right". */
      char *newest;
      size_t newlen = strlen_url(newurl);

      newest = malloc(newlen+1); /* get memory for this */
      if(!newest)
        return CURLE_OUT_OF_MEMORY;
      strcpy_url(newest, newurl); /* create a space-free URL */

      free(newurl); /* that was no good */
      newurl = newest; /* use this instead now */
    }

  }

  if(type == FOLLOW_FAKE) {
    /* we're only figuring out the new url if we would've followed locations
       but now we're done so we can get out! */
    data->info.wouldredirect = newurl;
    return CURLE_OK;
  }

  if(disallowport)
    data->state.allow_port = FALSE;

  if(data->change.url_alloc) {
    Curl_safefree(data->change.url);
    data->change.url_alloc = FALSE;
  }

  data->change.url = newurl;
  data->change.url_alloc = TRUE;
  newurl = NULL; /* don't free! */

  infof(data, "Issue another request to this URL: '%s'\n", data->change.url);

  /*
   * We get here when the HTTP code is 300-399 (and 401). We need to perform
   * differently based on exactly what return code there was.
   *
   * News from 7.10.6: we can also get here on a 401 or 407, in case we act on
   * a HTTP (proxy-) authentication scheme other than Basic.
   */
  switch(data->info.httpcode) {
    /* 401 - Act on a WWW-Authenticate, we keep on moving and do the
       Authorization: XXXX header in the HTTP request code snippet */
    /* 407 - Act on a Proxy-Authenticate, we keep on moving and do the
       Proxy-Authorization: XXXX header in the HTTP request code snippet */
    /* 300 - Multiple Choices */
    /* 306 - Not used */
    /* 307 - Temporary Redirect */
  default:  /* for all above (and the unknown ones) */
    /* Some codes are explicitly mentioned since I've checked RFC2616 and they
     * seem to be OK to POST to.
     */
    break;
  case 301: /* Moved Permanently */
    /* (quote from RFC2616, section 10.3.2):
     *
     * When automatically redirecting a POST request after receiving a 301
     * status code, some existing HTTP/1.0 user agents will erroneously change
     * it into a GET request.
     *
     * ----
     *
     * As most of the important user agents do this obvious RFC2616 violation,
     * many webservers expect this. So these servers often answers to a POST
     * request with an error page.  To be sure that libcurl gets the page that
     * most user agents would get, libcurl has to force GET.
     *
     * This behavior can be overridden with CURLOPT_POSTREDIR.
     */
    if((data->set.httpreq == HTTPREQ_POST
        || data->set.httpreq == HTTPREQ_POST_FORM)
       && !(data->set.keep_post & CURL_REDIR_POST_301)) {
      infof(data,
            "Violate RFC 2616/10.3.2 and switch from POST to GET\n");
      data->set.httpreq = HTTPREQ_GET;
    }
    break;
  case 302: /* Found */
    /* (From 10.3.3)

    Note: RFC 1945 and RFC 2068 specify that the client is not allowed
    to change the method on the redirected request.  However, most
    existing user agent implementations treat 302 as if it were a 303
    response, performing a GET on the Location field-value regardless
    of the original request method. The status codes 303 and 307 have
    been added for servers that wish to make unambiguously clear which
    kind of reaction is expected of the client.

    (From 10.3.4)

    Note: Many pre-HTTP/1.1 user agents do not understand the 303
    status. When interoperability with such clients is a concern, the
    302 status code may be used instead, since most user agents react
    to a 302 response as described here for 303.

    This behavior can be overridden with CURLOPT_POSTREDIR
    */
    if((data->set.httpreq == HTTPREQ_POST
        || data->set.httpreq == HTTPREQ_POST_FORM)
       && !(data->set.keep_post & CURL_REDIR_POST_302)) {
      infof(data,
            "Violate RFC 2616/10.3.3 and switch from POST to GET\n");
      data->set.httpreq = HTTPREQ_GET;
    }
    break;

  case 303: /* See Other */
    /* Disable both types of POSTs, unless the user explicitely
       asks for POST after POST */
    if(data->set.httpreq != HTTPREQ_GET
      && !(data->set.keep_post & CURL_REDIR_POST_303)) {
      data->set.httpreq = HTTPREQ_GET; /* enforce GET request */
      infof(data, "Disables POST, goes with %s\n",
            data->set.opt_no_body?"HEAD":"GET");
    }
    break;
  case 304: /* Not Modified */
    /* 304 means we did a conditional request and it was "Not modified".
     * We shouldn't get any Location: header in this response!
     */
    break;
  case 305: /* Use Proxy */
    /* (quote from RFC2616, section 10.3.6):
     * "The requested resource MUST be accessed through the proxy given
     * by the Location field. The Location field gives the URI of the
     * proxy.  The recipient is expected to repeat this single request
     * via the proxy. 305 responses MUST only be generated by origin
     * servers."
     */
    break;
  }
  Curl_pgrsTime(data, TIMER_REDIRECT);
  Curl_pgrsResetTimesSizes(data);

  return CURLE_OK;
#endif /* CURL_DISABLE_HTTP */
}